

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O0

void __thiscall
PointerBasedIterator_IPlusEqualN_Test::TestBody(PointerBasedIterator_IPlusEqualN_Test *this)

{
  bool bVar1;
  reference pvVar2;
  pointer_based_iterator<int> *ppVar3;
  char *pcVar4;
  AssertHelper local_88;
  Message local_80;
  pointer_based_iterator<int> local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  iterator i2;
  Message local_50 [3];
  pointer_based_iterator<int> local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  iterator i1;
  array<int,_2UL> arr;
  PointerBasedIterator_IPlusEqualN_Test *this_local;
  
  i1.pos_ = (pointer)0x300000001;
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&i1,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>
            ((pointer_based_iterator<int> *)&gtest_ar.message_,pvVar2);
  ppVar3 = pstore::pointer_based_iterator<int>::operator+=
                     ((pointer_based_iterator<int> *)&gtest_ar.message_,2);
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&i1,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>(&local_38,pvVar2 + 2);
  testing::internal::EqHelper::
  Compare<pstore::pointer_based_iterator<int>,_pstore::pointer_based_iterator<int>,_nullptr>
            ((EqHelper *)local_30,"i1 += 2","iterator{&arr[0] + 2}",ppVar3,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i2,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i2);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&i1,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>
            ((pointer_based_iterator<int> *)&gtest_ar_1.message_,pvVar2 + 2);
  ppVar3 = pstore::pointer_based_iterator<int>::operator+=
                     ((pointer_based_iterator<int> *)&gtest_ar_1.message_,-2);
  pvVar2 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&i1,0);
  pstore::pointer_based_iterator<int>::pointer_based_iterator<int,void>(&local_78,pvVar2);
  testing::internal::EqHelper::
  Compare<pstore::pointer_based_iterator<int>,_pstore::pointer_based_iterator<int>,_nullptr>
            ((EqHelper *)local_70,"i2 += -2","iterator{&arr[0]}",ppVar3,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, IPlusEqualN) {
    std::array<int, 2> arr{{1, 3}};

    iterator i1{&arr[0]};
    EXPECT_EQ (i1 += 2, iterator{&arr[0] + 2});

    iterator i2{&arr[0] + 2};
    EXPECT_EQ (i2 += -2, iterator{&arr[0]});
}